

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

PackageImportDeclarationSyntax * __thiscall
slang::parsing::Parser::parseImportDeclaration(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  SourceLocation location;
  PackageImportItemSyntax *pPVar3;
  undefined4 extraout_var;
  PackageImportDeclarationSyntax *pPVar4;
  Info *extraout_RDX;
  Info *src;
  ulong uVar5;
  TokenKind kind;
  Token TVar6;
  Token TVar7;
  Token TVar8;
  Token keyword;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> items;
  Token local_148;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_138;
  ulong local_128;
  undefined8 uStack_120;
  size_t local_118;
  pointer local_110;
  size_t local_108;
  Info *local_100;
  undefined8 local_f8;
  pointer local_f0;
  size_t local_e8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_e0 [2];
  Token local_68;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  pointer local_40;
  
  local_e8 = (size_t)attributes._M_extent._M_extent_value;
  local_f0 = attributes._M_ptr;
  TVar6 = ParserBase::consume(&this->super_ParserBase);
  local_100 = TVar6.info;
  local_f8 = TVar6._0_8_;
  Token::Token(&local_148);
  local_e0[0].data_ = (pointer)local_e0[0].firstElement;
  local_e0[0].len = 0;
  local_e0[0].cap = 4;
  TVar6 = ParserBase::peek(&this->super_ParserBase);
  local_68 = TVar6;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar6.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&local_68);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x490005,location);
    }
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(TVar6.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar6,Semicolon,&local_148,(DiagCode)0x490005);
      src = extraout_RDX;
      goto LAB_003ab7f0;
    }
    local_138._M_rest =
         (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parsePackageImportItem(this);
    local_128 = CONCAT71(local_128._1_7_,1);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_e0,(TokenOrSyntax *)&local_138._M_first);
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar7.kind);
    if (TVar7.kind == Comma && !bVar1) {
      do {
        local_138._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_128 = local_128 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_e0,(TokenOrSyntax *)&local_138._M_first);
        TVar7 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar7.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((TVar6.info == TVar7.info && TVar6.kind == kind) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                              (&this->super_ParserBase,(DiagCode)0x490005,true), !bVar1)) break;
        pPVar3 = parsePackageImportItem(this);
        local_138._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar3;
        local_128 = CONCAT71(local_128._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_e0,(TokenOrSyntax *)&local_138._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar8.kind);
        uVar5 = TVar7._0_8_ & 0xffffffff;
        TVar6.info = TVar7.info;
        TVar6.kind = (short)uVar5;
        TVar6._2_1_ = (char)(uVar5 >> 0x10);
        TVar6.numFlags.raw = (char)(uVar5 >> 0x18);
        TVar6.rawLen = (int)(uVar5 >> 0x20);
      } while (TVar8.kind == Comma && !bVar1);
    }
  }
  local_148 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = local_148.info;
LAB_003ab7f0:
  local_138._8_4_ = 1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = local_e8;
  local_110 = local_f0;
  local_108 = local_e8;
  local_138._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005c7a10;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_e0,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_40 = (pointer)CONCAT44(extraout_var,iVar2);
  local_68.info._0_4_ = 3;
  local_58 = (SyntaxNode *)0x0;
  pSStack_50 = (SyntaxNode *)0x0;
  local_68._0_8_ = &PTR_getChild_005cb340;
  keyword.info = local_100;
  keyword.kind = (undefined2)local_f8;
  keyword._2_1_ = local_f8._2_1_;
  keyword.numFlags.raw = local_f8._3_1_;
  keyword.rawLen = local_f8._4_4_;
  pPVar4 = slang::syntax::SyntaxFactory::packageImportDeclaration
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_138._M_first,
                      keyword,(SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)
                              &local_68,local_148);
  local_138._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar4;
  std::
  vector<slang::syntax::PackageImportDeclarationSyntax_const*,std::allocator<slang::syntax::PackageImportDeclarationSyntax_const*>>
  ::emplace_back<slang::syntax::PackageImportDeclarationSyntax_const*>
            ((vector<slang::syntax::PackageImportDeclarationSyntax_const*,std::allocator<slang::syntax::PackageImportDeclarationSyntax_const*>>
              *)&(this->meta).packageImports,(PackageImportDeclarationSyntax **)&local_138._M_rest);
  if (local_e0[0].data_ != (pointer)local_e0[0].firstElement) {
    operator_delete(local_e0[0].data_);
  }
  return pPVar4;
}

Assistant:

PackageImportDeclarationSyntax& Parser::parseImportDeclaration(AttrList attributes) {
    auto keyword = consume();

    Token semi;
    SmallVector<TokenOrSyntax, 4> items;
    parseList<isIdentifierOrComma, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedPackageImport,
                                                [this] { return &parsePackageImportItem(); });

    auto& result = factory.packageImportDeclaration(attributes, keyword, items.copy(alloc), semi);
    meta.packageImports.push_back(&result);
    return result;
}